

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.cpp
# Opt level: O2

void __thiscall vera::Pyramid::allocate(Pyramid *this,int _width,int _height)

{
  int iVar1;
  ulong uVar2;
  uint i;
  ulong uVar3;
  Fbo *pFVar4;
  double dVar5;
  float local_38;
  float fStack_34;
  
  iVar1 = _width;
  if (_height < _width) {
    iVar1 = _height;
  }
  dVar5 = log2((double)iVar1);
  uVar3 = 0xc;
  if ((uint)(long)(dVar5 + -1.0) < 0xc) {
    uVar3 = (long)(dVar5 + -1.0);
  }
  uVar2 = uVar3 & 0xffffffff;
  this->m_depth = (uint)uVar3;
  this->m_width = _width;
  this->m_height = _height;
  local_38 = (float)_width;
  fStack_34 = (float)_height;
  pFVar4 = this->m_downs;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    local_38 = local_38 * 0.5;
    fStack_34 = fStack_34 * 0.5;
    (*pFVar4->_vptr_Fbo[2])(pFVar4,(long)local_38,(long)fStack_34,2,1,1,1);
    uVar2 = (ulong)this->m_depth;
    pFVar4 = pFVar4 + 1;
  }
  pFVar4 = this->m_ups;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    local_38 = local_38 + local_38;
    fStack_34 = fStack_34 + fStack_34;
    (*pFVar4->_vptr_Fbo[2])(pFVar4,(long)local_38,(long)fStack_34,2,1,1,1);
    uVar2 = (ulong)this->m_depth;
    pFVar4 = pFVar4 + 1;
  }
  return;
}

Assistant:

void Pyramid::allocate(int _width, int _height) {
    m_depth = log2(std::min(_width, _height)) - 1;
    m_depth = std::min((unsigned int)PYRAMID_MAX_LAYERS, m_depth);

    m_width = _width;
    m_height = _height;

    float w = _width;
    float h = _height;

    for (unsigned int i = 0; i < m_depth; i++) {
        w *= 0.5f;
        h *= 0.5f;
        m_downs[i].allocate(w, h, vera::COLOR_FLOAT_TEXTURE, vera::TextureFilter::NEAREST, vera::TextureWrap::CLAMP);
    }
    
    for (unsigned int i = 0; i < m_depth; i++) {
        w *= 2.0f;
        h *= 2.0f;
        m_ups[i].allocate(w, h, vera::COLOR_FLOAT_TEXTURE, vera::TextureFilter::NEAREST, vera::TextureWrap::CLAMP);
    }
}